

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O1

void __thiscall
QSystemTrayIconSys::QSystemTrayIconSys(QSystemTrayIconSys *this,QSystemTrayIcon *qIn)

{
  long in_FS_OFFSET;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::QWidget((QWidget *)this,(QWidget *)0x0,(WindowFlags)0xc01);
  *(undefined ***)this = &PTR_metaObject_00824560;
  *(undefined ***)(this + 0x10) = &PTR__QSystemTrayIconSys_00824710;
  *(QSystemTrayIcon **)(this + 0x28) = qIn;
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = L"QSystemTrayIconSys";
  local_38.d.size = 0x12;
  QObject::doSetObjectName((QString *)this);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  QSystemTrayIcon::toolTip(&local_38,*(QSystemTrayIcon **)(this + 0x28));
  QWidget::setToolTip((QWidget *)this,&local_38);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  QWidget::setAttribute((QWidget *)this,WA_AlwaysShowToolTips,true);
  QWidget::setAttribute((QWidget *)this,WA_QuitOnClose,false);
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char16_t *)0x1500000015;
  QWidget::setGeometry((QWidget *)this,(QRect *)&local_38);
  QWidget::setMinimumSize((QWidget *)this,0x16,0x16);
  QWidget::setAttribute((QWidget *)this,WA_TranslucentBackground,true);
  QWidget::setAttribute((QWidget *)this,WA_MouseTracking,true);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSystemTrayIconSys::QSystemTrayIconSys(QSystemTrayIcon *qIn)
    : QWidget(nullptr, Qt::Window | Qt::FramelessWindowHint | Qt::BypassWindowManagerHint)
    , q(qIn)
{
    setObjectName(QStringLiteral("QSystemTrayIconSys"));
#if QT_CONFIG(tooltip)
    setToolTip(q->toolTip());
#endif
    setAttribute(Qt::WA_AlwaysShowToolTips, true);
    setAttribute(Qt::WA_QuitOnClose, false);
    const QSize size(22, 22); // Gnome, standard size
    setGeometry(QRect(QPoint(0, 0), size));
    setMinimumSize(size);
    setAttribute(Qt::WA_TranslucentBackground);
    setMouseTracking(true);
}